

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::passModel(Highs *this,HighsModel *model)

{
  bool bVar1;
  HighsStatus from_return_status;
  HighsStatus HVar2;
  HighsInt HVar3;
  long in_RDI;
  HighsLp *in_stack_00000068;
  HighsLogOptions *in_stack_00000070;
  HighsOptions *in_stack_000000e0;
  HighsHessian *in_stack_000000e8;
  HighsOptions *in_stack_000001c0;
  HighsLp *in_stack_000001c8;
  HighsHessian *hessian;
  HighsLp *lp;
  HighsStatus return_status;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  Highs *in_stack_fffffffffffffcf0;
  allocator *paVar4;
  undefined4 in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  HighsInt in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  HighsStatus in_stack_fffffffffffffd38;
  HighsStatus call_status;
  Highs *this_00;
  allocator local_289;
  string local_288 [16];
  Highs *in_stack_fffffffffffffd88;
  allocator local_201;
  string local_200 [135];
  allocator local_179;
  string local_178 [80];
  HighsLogOptions *in_stack_fffffffffffffed8;
  HighsLp *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  undefined1 local_f1 [152];
  allocator local_59;
  string local_58 [36];
  undefined4 local_34;
  HighsHessian *local_30;
  HighsLp *local_28;
  HighsStatus local_1c;
  HighsStatus local_4;
  
  logHeader(in_stack_fffffffffffffcf0);
  if ((*(uint *)(in_RDI + 0xc08) & 1) != 0) {
    analyseLp(in_stack_00000070,in_stack_00000068);
  }
  local_1c = kOk;
  clearModel(in_stack_fffffffffffffcf0);
  local_28 = (HighsLp *)(in_RDI + 0x138);
  local_30 = (HighsHessian *)(in_RDI + 0x4d0);
  HighsLp::operator=((HighsLp *)in_stack_fffffffffffffcf0,
                     (HighsLp *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  HighsHessian::operator=
            ((HighsHessian *)in_stack_fffffffffffffcf0,
             (HighsHessian *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  if ((local_28->num_col_ == 0) || (local_28->num_row_ == 0)) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                 "Model has either no columns or no rows, so ignoring user constraint matrix data and initialising empty matrix\n"
                );
    (local_28->a_matrix_).format_ = kColwise;
    local_34 = 0;
    std::vector<int,_std::allocator<int>_>::assign
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0,
               CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
               (value_type_conflict2 *)0x48504d);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x485065);
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x48507d);
  }
  else {
    bVar1 = HighsSparseMatrix::formatOk((HighsSparseMatrix *)in_stack_fffffffffffffcf0);
    if (!bVar1) {
      return kError;
    }
  }
  HighsLp::setMatrixDimensions(local_28);
  HighsLp::resetScale((HighsLp *)0x4850c3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"passModel",&local_59);
  bVar1 = lpDimensionsOk(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                         in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar1 = HighsHessian::formatOk(local_30);
    if (bVar1) {
      HighsLogOptions::HighsLogOptions
                ((HighsLogOptions *)in_stack_fffffffffffffcf0,
                 (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      assessLp(in_stack_000001c8,in_stack_000001c0);
      this_00 = (Highs *)local_f1;
      call_status = local_1c;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_f1 + 1),"assessLp",(allocator *)this_00);
      from_return_status =
           interpretCallStatus((HighsLogOptions *)this_00,call_status,in_stack_fffffffffffffd38,
                               (string *)
                               CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      local_1c = from_return_status;
      std::__cxx11::string::~string((string *)(local_f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_f1);
      HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x485291);
      if (local_1c == kError) {
        local_4 = local_1c;
      }
      else {
        HighsLp::ensureColwise((HighsLp *)0x485327);
        HighsLogOptions::HighsLogOptions
                  ((HighsLogOptions *)in_stack_fffffffffffffcf0,
                   (HighsLogOptions *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8))
        ;
        HVar2 = assessHessian(in_stack_000000e8,in_stack_000000e0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_178,"assessHessian",&local_179);
        local_1c = interpretCallStatus((HighsLogOptions *)this_00,call_status,from_return_status,
                                       (string *)CONCAT44(HVar2,in_stack_fffffffffffffd30));
        std::__cxx11::string::~string(local_178);
        std::allocator<char>::~allocator((allocator<char> *)&local_179);
        HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4853f6);
        if (local_1c == kError) {
          local_4 = local_1c;
        }
        else {
          if ((local_30->dim_ != 0) &&
             (HVar3 = HighsHessian::numNz((HighsHessian *)0x485499), HVar3 == 0)) {
            highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                         "Hessian has dimension %d but no nonzeros, so is ignored\n",
                         (ulong)(uint)local_30->dim_);
            HighsHessian::clear((HighsHessian *)in_stack_fffffffffffffcf0);
          }
          if (local_30->dim_ != 0) {
            completeHessian(in_stack_fffffffffffffd04,
                            (HighsHessian *)
                            CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
          }
          HighsLogOptions::HighsLogOptions
                    ((HighsLogOptions *)in_stack_fffffffffffffcf0,
                     (HighsLogOptions *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          clearSolver(in_stack_fffffffffffffcf0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_200,"clearSolver",&local_201);
          local_1c = interpretCallStatus((HighsLogOptions *)this_00,call_status,from_return_status,
                                         (string *)CONCAT44(HVar2,in_stack_fffffffffffffd30));
          std::__cxx11::string::~string(local_200);
          std::allocator<char>::~allocator((allocator<char> *)&local_201);
          HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4855c4);
          HighsLogOptions::HighsLogOptions
                    ((HighsLogOptions *)in_stack_fffffffffffffcf0,
                     (HighsLogOptions *)
                     CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
          optionChangeAction(in_stack_fffffffffffffd88);
          paVar4 = &local_289;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_288,"optionChangeAction",paVar4);
          local_1c = interpretCallStatus((HighsLogOptions *)this_00,call_status,from_return_status,
                                         (string *)CONCAT44(HVar2,in_stack_fffffffffffffd30));
          std::__cxx11::string::~string(local_288);
          std::allocator<char>::~allocator((allocator<char> *)&local_289);
          HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x48567e);
          local_4 = returnFromHighs(this_00,call_status);
        }
      }
    }
    else {
      local_4 = kError;
    }
  }
  else {
    local_4 = kError;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::passModel(HighsModel model) {
  // This is the "master" Highs::passModel, in that all the others
  // (and readModel) eventually call it
  this->logHeader();
  // Possibly analyse the LP data
  if (kHighsAnalysisLevelModelData & options_.highs_analysis_level)
    analyseLp(options_.log_options, model.lp_);
  HighsStatus return_status = HighsStatus::kOk;
  // Clear the incumbent model and any associated data
  clearModel();
  HighsLp& lp = model_.lp_;
  HighsHessian& hessian = model_.hessian_;
  // Move the model's LP and Hessian to the internal LP and Hessian
  lp = std::move(model.lp_);
  hessian = std::move(model.hessian_);
  assert(lp.a_matrix_.formatOk());
  if (lp.num_col_ == 0 || lp.num_row_ == 0) {
    // Model constraint matrix has either no columns or no
    // rows. Clearly the matrix is empty, so may have no orientation
    // or starts assigned. HiGHS assumes that such a model will have
    // null starts, so make it column-wise
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Model has either no columns or no rows, so ignoring user "
                 "constraint matrix data and initialising empty matrix\n");
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.a_matrix_.start_.assign(lp.num_col_ + 1, 0);
    lp.a_matrix_.index_.clear();
    lp.a_matrix_.value_.clear();
  } else {
    // Matrix has rows and columns, so a_matrix format must be valid
    if (!lp.a_matrix_.formatOk()) return HighsStatus::kError;
  }
  // Dimensions in a_matrix_ may not be set, so take them from lp.
  lp.setMatrixDimensions();
  // Residual scale factors may be present. ToDo Allow user-defined
  // scale factors to be passed
  assert(!lp.is_scaled_);
  assert(!lp.is_moved_);
  lp.resetScale();
  // Check that the LP array dimensions are valid
  if (!lpDimensionsOk("passModel", lp, options_.log_options))
    return HighsStatus::kError;
  // Check that the Hessian format is valid
  if (!hessian.formatOk()) return HighsStatus::kError;
  // Check validity of the LP, normalising its values
  return_status = interpretCallStatus(
      options_.log_options, assessLp(lp, options_), return_status, "assessLp");
  if (return_status == HighsStatus::kError) return return_status;
  // Now legality of matrix is established, ensure that it is
  // column-wise
  lp.ensureColwise();
  // Check validity of any Hessian, normalising its entries
  return_status = interpretCallStatus(options_.log_options,
                                      assessHessian(hessian, options_),
                                      return_status, "assessHessian");
  if (return_status == HighsStatus::kError) return return_status;
  if (hessian.dim_) {
    // Clear any zero Hessian
    if (hessian.numNz() == 0) {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Hessian has dimension %" HIGHSINT_FORMAT
                   " but no nonzeros, so is ignored\n",
                   hessian.dim_);
      hessian.clear();
    }
  }
  // Ensure that any non-zero Hessian of dimension less than the
  // number of columns in the model is completed
  if (hessian.dim_) completeHessian(this->model_.lp_.num_col_, hessian);
  // Clear solver status, solution, basis and info associated with any
  // previous model; clear any HiGHS model object; create a HiGHS
  // model object for this LP
  return_status = interpretCallStatus(options_.log_options, clearSolver(),
                                      return_status, "clearSolver");
  // Apply any user scaling in call to optionChangeAction
  return_status =
      interpretCallStatus(options_.log_options, optionChangeAction(),
                          return_status, "optionChangeAction");
  return returnFromHighs(return_status);
}